

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

bool wasm::replaceChildWith(Expression *expr,Expression *with)

{
  char cVar1;
  Index IVar2;
  Expression **ppEVar3;
  AbstractChildIterator<wasm::ChildIterator> *pAVar4;
  bool bVar5;
  bool bVar6;
  Iterator IVar7;
  AbstractChildIterator<wasm::ChildIterator> local_a8;
  _Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_> local_68;
  pointer local_50;
  pointer local_48;
  Iterator local_40;
  
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a8,expr);
  local_40.index = 0;
  local_40.parent = &local_a8;
  IVar7 = AbstractChildIterator<wasm::ChildIterator>::end(&local_a8);
  IVar2 = 0;
  pAVar4 = &local_a8;
  do {
    bVar5 = IVar2 != IVar7.index;
    bVar6 = pAVar4 != IVar7.parent;
    if (!bVar6 && !bVar5) {
LAB_0014fc6f:
      std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
                (&local_a8.children.flexible.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
      return bVar6 || bVar5;
    }
    ppEVar3 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_40);
    cVar1 = wasm::Type::isSubType((Type)(with->type).id,(Type)((*ppEVar3)->type).id);
    if (cVar1 != '\0') {
      FindAll<wasm::Pop>::FindAll((FindAll<wasm::Pop> *)&local_68,*ppEVar3);
      local_50 = local_68._M_impl.super__Vector_impl_data._M_start;
      local_48 = local_68._M_impl.super__Vector_impl_data._M_finish;
      std::_Vector_base<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>::~_Vector_base(&local_68);
      if (local_50 == local_48) {
        *ppEVar3 = with;
        goto LAB_0014fc6f;
      }
    }
    IVar2 = local_40.index + 1;
    pAVar4 = local_40.parent;
    local_40.index = IVar2;
  } while( true );
}

Assistant:

static bool replaceChildWith(Expression* expr, Expression* with) {
  for (auto*& child : ChildIterator(expr)) {
    // To replace, we must have an appropriate type, and we cannot replace a
    // Pop under any circumstances.
    if (Type::isSubType(with->type, child->type) &&
        FindAll<Pop>(child).list.empty()) {
      child = with;
      return true;
    }
  }
  return false;
}